

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O1

void __thiscall
Refal2::
CDictionary<std::unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::grow(CDictionary<std::unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,int newCapacity)

{
  CKeyDataPair *__src;
  CKeyDataPair *__dest;
  
  if (this->capacity < newCapacity) {
    this->capacity = newCapacity;
    __dest = (CKeyDataPair *)operator_new((long)newCapacity << 4);
    __src = this->keyDataPairs;
    memcpy(__dest,__src,(long)this->size << 4);
    operator_delete(__src);
    this->keyDataPairs = __dest;
    return;
  }
  __assert_fail("newCapacity > capacity",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/Dictionary.h"
                ,0x95,
                "void Refal2::CDictionary<std::unique_ptr<Refal2::CPreparatoryFunction>>::grow(int) [Data = std::unique_ptr<Refal2::CPreparatoryFunction>, Key = std::basic_string<char>]"
               );
}

Assistant:

void CDictionary<Data, Key>::grow( int newCapacity )
{
	assert( newCapacity > capacity );
	capacity = newCapacity;
	void* memory = ::operator new( capacity * sizeof( CKeyDataPair ) );
	::memcpy( memory, keyDataPairs, size * sizeof( CKeyDataPair ) );
	::operator delete( keyDataPairs );
	keyDataPairs = static_cast<CKeyDataPair*>( memory );
}